

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::PeekType(TypeChecker *this,Index depth,Type *out_type)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  Type local_38;
  Enum local_34;
  Label *local_30;
  Label *label;
  Type *out_type_local;
  TypeChecker *pTStack_18;
  Index depth_local;
  TypeChecker *this_local;
  
  label = (Label *)out_type;
  out_type_local._4_4_ = depth;
  pTStack_18 = this;
  local_34 = (Enum)TopLabel(this,&local_30);
  bVar2 = Failed((Result)local_34);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    sVar1 = local_30->type_stack_limit;
    uVar5 = (ulong)out_type_local._4_4_;
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    if (sVar1 + uVar5 < sVar3) {
      sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
      pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         (&this->type_stack_,(sVar3 - out_type_local._4_4_) - 1);
      label->label_type = pvVar4->enum_;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      Type::Type(&local_38,Any);
      label->label_type = local_38.enum_;
      Result::Result((Result *)((long)&this_local + 4),(uint)((local_30->unreachable & 1U) == 0));
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::PeekType(Index depth, Type* out_type) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));

  if (label->type_stack_limit + depth >= type_stack_.size()) {
    *out_type = Type::Any;
    return label->unreachable ? Result::Ok : Result::Error;
  }
  *out_type = type_stack_[type_stack_.size() - depth - 1];
  return Result::Ok;
}